

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckArmorType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *this;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  PClass *pPVar5;
  AInventory *pAVar6;
  uint uVar7;
  char *pcVar8;
  bool bVar9;
  undefined8 local_38;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    local_38 = in_RAX;
  }
  else {
    local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),numret);
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (this->super_DThinker).super_DObject.Class;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c8c37;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          iVar3 = param[1].field_0.i;
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_003c8b8e;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_003c8b8e:
              iVar1 = param[2].field_0.i;
              local_38 = CONCAT44(0x60,(int)local_38);
              pAVar6 = AActor::FindInventory(this,(FName *)((long)&local_38 + 4));
              iVar4 = 0;
              uVar7 = 0;
              if ((pAVar6 != (AInventory *)0x0) &&
                 (*(int *)((long)&pAVar6[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4)
                  == iVar3)) {
                uVar7 = (uint)(iVar1 <= pAVar6->Amount);
              }
              if (0 < (int)local_38) {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x4d8,
                                "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\0') {
                  __assert_fail("RegType == REGT_INT",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x13f,"void VMReturn::SetInt(int)");
                }
                *(uint *)ret->Location = uVar7;
                iVar4 = 1;
              }
              return iVar4;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x4d4,
                        "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d3,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c8c37:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x4d2,
                "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_INT_DEF(amount);

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	ACTION_RETURN_BOOL(armor && armor->ArmorType == type && armor->Amount >= amount);
}